

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O1

void __thiscall
sznet::net::SelectPoller::fillActiveChannels
          (SelectPoller *this,int numEvents,ChannelList *activeChannels)

{
  _Rb_tree_header *p_Var1;
  pointer *pppCVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  iterator __position;
  Channel *in_RAX;
  uint uVar5;
  uint uVar6;
  int iVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  _Rb_tree_header *p_Var10;
  pointer pEVar11;
  bool bVar12;
  Channel *local_38;
  Channel *channel;
  
  pEVar11 = (this->m_pollfds).
            super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < numEvents &&
      pEVar11 !=
      (this->m_pollfds).
      super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header;
    local_38 = in_RAX;
    do {
      uVar3 = pEVar11->fd;
      uVar5 = uVar3 + 0x3f;
      if (-1 < (int)uVar3) {
        uVar5 = uVar3;
      }
      iVar7 = (int)uVar5 >> 6;
      uVar9 = (ulong)uVar3;
      bVar12 = ((ulong)(this->m_rfds).fds_bits[iVar7] >> (uVar9 & 0x3f) & 1) != 0;
      uVar5 = bVar12 + 8;
      if (((ulong)(this->m_wfds).fds_bits[iVar7] >> (uVar9 & 0x3f) & 1) == 0) {
        uVar5 = (uint)bVar12;
      }
      uVar6 = uVar5 + 0x10;
      if (((ulong)(this->m_efds).fds_bits[iVar7] >> (uVar9 & 0x3f) & 1) == 0) {
        uVar6 = uVar5;
      }
      if (uVar6 != 0) {
        p_Var4 = (this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
        p_Var8 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
            p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < (int)uVar3]) {
          if ((int)uVar3 <= (int)*(size_t *)(p_Var4 + 1)) {
            p_Var8 = p_Var4;
          }
        }
        p_Var10 = p_Var1;
        if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
           (p_Var10 = (_Rb_tree_header *)p_Var8,
           (int)uVar3 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
          p_Var10 = p_Var1;
        }
        if (p_Var10 == p_Var1) {
          __assert_fail("ch != m_channels.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                        ,100,
                        "void sznet::net::SelectPoller::fillActiveChannels(int, ChannelList *) const"
                       );
        }
        local_38 = *(Channel **)(p_Var10 + 1);
        if (local_38->m_fd != pEVar11->fd) {
          __assert_fail("channel->fd() == it->fd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                        ,0x66,
                        "void sznet::net::SelectPoller::fillActiveChannels(int, ChannelList *) const"
                       );
        }
        local_38->m_revents = uVar6;
        __position._M_current =
             (activeChannels->
             super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (activeChannels->
            super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<sznet::net::Channel*,std::allocator<sznet::net::Channel*>>::
          _M_realloc_insert<sznet::net::Channel*const&>
                    ((vector<sznet::net::Channel*,std::allocator<sznet::net::Channel*>> *)
                     activeChannels,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppCVar2 = &(activeChannels->
                      super__Vector_base<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar2 = *pppCVar2 + 1;
        }
        numEvents = numEvents + -1;
      }
      pEVar11 = pEVar11 + 1;
    } while ((pEVar11 !=
              (this->m_pollfds).
              super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
              ._M_impl.super__Vector_impl_data._M_finish) && (0 < numEvents));
  }
  return;
}

Assistant:

void SelectPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const
{
	for (auto it = m_pollfds.begin(); it != m_pollfds.end() && numEvents > 0; ++it)
	{
		unsigned int revents = 0;
		if (FD_ISSET(it->fd, &m_rfds))
		{
			revents |= Channel::kReadEvent;
		}
		if (FD_ISSET(it->fd, &m_wfds))
		{
			revents |= Channel::kWriteEvent;
		}
		if (FD_ISSET(it->fd, &m_efds))
		{
			revents |= Channel::kErrorEvent;
		}
		if (revents > 0)
		{
			--numEvents;
			ChannelMap::const_iterator ch = m_channels.find(it->fd);
			assert(ch != m_channels.end());
			Channel* channel = ch->second;
			assert(channel->fd() == it->fd);
			channel->set_revents(revents);
			activeChannels->push_back(channel);
		}
	}
}